

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O1

char __thiscall Imaginer::Utils::iRpn::getFun(iRpn *this,string *funname)

{
  size_t __n;
  int iVar1;
  char cVar2;
  long lVar3;
  
  __n = funname->_M_string_length;
  cVar2 = -1;
  lVar3 = 8;
  do {
    if (__n == *(size_t *)((long)&_sysfunS_abi_cxx11_ + lVar3)) {
      if (__n == 0) goto LAB_00106581;
      iVar1 = bcmp((funname->_M_dataplus)._M_p,*(void **)(lVar3 + 0x10b548),__n);
      if (iVar1 == 0) goto LAB_00106581;
    }
    cVar2 = cVar2 + '\x01';
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x288);
  cVar2 = '\x13';
LAB_00106581:
  return cVar2 + -0x7f;
}

Assistant:

char   iRpn::getFun(std::string funname)
{
    char index = -1;
    while(++index < FUNNUM && funname != _sysfunS[index]);
    //    std::cout << _sysfunS[index] << std::endl;
    return (index - 128);
}